

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::~EventLoop(EventLoop *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  EVP_PKEY_CTX *in_RSI;
  
  cleanup(this,in_RSI);
  std::
  _Hashtable<EventLoop::TimerData_*,_EventLoop::TimerData_*,_std::allocator<EventLoop::TimerData_*>,_std::__detail::_Identity,_EventLoop::TimerDataHash,_EventLoop::TimerDataHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->mTimersById)._M_h);
  std::
  _Rb_tree<EventLoop::TimerData_*,_EventLoop::TimerData_*,_std::_Identity<EventLoop::TimerData_*>,_EventLoop::TimerDataSet,_std::allocator<EventLoop::TimerData_*>_>
  ::~_Rb_tree(&(this->mTimersByTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
  ::~_Rb_tree(&(this->mSockets)._M_t);
  std::_Deque_base<Event_*,_std::allocator<Event_*>_>::~_Deque_base
            ((_Deque_base<Event_*,_std::allocator<Event_*>_> *)&this->mEvents);
  p_Var2 = (this->super_enable_shared_from_this<EventLoop>)._M_weak_this.
           super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

EventLoop::~EventLoop()
{
    cleanup();
}